

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O2

void nh_lib_exit(void)

{
  long lVar1;
  
  xmalloc_cleanup();
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    free(fqn_prefix[lVar1]);
    fqn_prefix[lVar1] = (char *)0x0;
  }
  cleanup_opt_struct();
  return;
}

Assistant:

void nh_lib_exit(void)
{
    int i;
    
    xmalloc_cleanup();
    
    for (i = 0; i < PREFIX_COUNT; i++) {
	free(fqn_prefix[i]);
	fqn_prefix[i] = NULL;
    }
    
    cleanup_opt_struct();
}